

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

bool read_input(bool filename_is_code,string *filename,string *input)

{
  pointer pcVar1;
  bool bVar2;
  undefined7 in_register_00000039;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000039,filename_is_code) == 0) {
    pcVar1 = (filename->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + filename->_M_string_length);
    bVar2 = read_input_content(&local_48,input);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)input);
    bVar2 = true;
  }
  change_special_filename(filename_is_code,filename);
  return bVar2;
}

Assistant:

bool read_input(
    bool filename_is_code, std::string *filename, std::string *input)
{
    bool ok;
    if (filename_is_code) {
        *input = *filename;
        ok = true;
    } else {
        ok = read_input_content(*filename, input);
    }
    // Let's change the filename to something we can show the user
    // if it is not a real filename.
    change_special_filename(filename_is_code, filename);
    return ok;
}